

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_softmax_impl(llama_token_data_array *cur_p)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  llama_token lVar4;
  ulong uVar5;
  llama_token_data *plVar6;
  long lVar7;
  llama_token_data *plVar8;
  llama_token_data *plVar9;
  llama_token_data *plVar10;
  size_t sVar11;
  size_t sVar12;
  float *pfVar13;
  llama_token_data *__i;
  llama_token_data *plVar14;
  float fVar15;
  float fVar16;
  
  uVar5 = cur_p->size;
  if (uVar5 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
               ,0xcc,"GGML_ASSERT(%s) failed","cur_p->size > 0");
  }
  if (cur_p->sorted == false) {
    plVar9 = cur_p->data;
    plVar6 = plVar9 + uVar5;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<llama_token_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
              (plVar9,plVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar5 < 0x11) {
      std::
      __insertion_sort<llama_token_data*,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                (plVar9,plVar6);
    }
    else {
      plVar14 = plVar9 + 0x10;
      std::
      __insertion_sort<llama_token_data*,__gnu_cxx::__ops::_Iter_comp_iter<llama_sampler_softmax_impl(llama_token_data_array*)::__0>>
                (plVar9,plVar14);
      do {
        lVar4 = plVar14->id;
        uVar2 = plVar14->logit;
        uVar3 = plVar14->p;
        plVar9 = plVar14;
        plVar10 = plVar14;
        if (plVar14[-1].logit <= (float)uVar2 && (float)uVar2 != plVar14[-1].logit) {
          do {
            plVar9 = plVar10 + -1;
            plVar10->p = plVar10[-1].p;
            fVar16 = plVar10[-1].logit;
            plVar10->id = plVar10[-1].id;
            plVar10->logit = fVar16;
            plVar8 = plVar10 + -2;
            plVar10 = plVar9;
          } while (plVar8->logit <= (float)uVar2 && (float)uVar2 != plVar8->logit);
        }
        plVar9->id = lVar4;
        plVar9->logit = (float)uVar2;
        plVar9->p = (float)uVar3;
        plVar14 = plVar14 + 1;
      } while (plVar14 != plVar6);
    }
    cur_p->sorted = true;
  }
  plVar6 = cur_p->data;
  sVar11 = cur_p->size;
  if (sVar11 == 0) {
    fVar16 = 0.0;
  }
  else {
    fVar1 = plVar6->logit;
    pfVar13 = &plVar6->p;
    fVar16 = 0.0;
    sVar12 = sVar11;
    do {
      fVar15 = expf(pfVar13[-1] - fVar1);
      *pfVar13 = fVar15;
      fVar16 = fVar16 + fVar15;
      pfVar13 = pfVar13 + 3;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  if (sVar11 != 0) {
    pfVar13 = &plVar6->p;
    do {
      *pfVar13 = *pfVar13 / fVar16;
      pfVar13 = pfVar13 + 3;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
  }
  return;
}

Assistant:

static void llama_sampler_softmax_impl(llama_token_data_array * cur_p) {
    GGML_ASSERT(cur_p->size > 0);

    // Sort the logits in descending order
    if (!cur_p->sorted) {
        std::sort(cur_p->data, cur_p->data + cur_p->size, [](const llama_token_data & a, const llama_token_data & b) {
            return a.logit > b.logit;
        });
        cur_p->sorted = true;
    }

    float max_l = cur_p->data[0].logit;
    float cum_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        float p = expf(cur_p->data[i].logit - max_l);
        cur_p->data[i].p = p;
        cum_sum += p;
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= cum_sum;
    }
}